

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase555::run(TestCase555 *this)

{
  SleepHooks SVar1;
  undefined8 uVar2;
  PromiseArenaMember *node;
  Fault node_00;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  void *pvVar6;
  undefined8 extraout_RAX;
  ulong uVar7;
  char *pcVar8;
  nfds_t __nfds;
  nfds_t __nfds_00;
  Exception *this_00;
  pollfd *ppVar9;
  bool writable;
  Fault f_2;
  OwnFd outfd;
  OwnFd infd;
  Promise<void> promise;
  Fault f_1;
  int pipefds [2];
  WaitScope waitScope;
  FdObserver observer;
  EventLoop loop;
  UnixEventPort port;
  char buffer [4096];
  undefined1 local_1231;
  undefined1 local_1230 [12];
  uint local_1224;
  PromiseArenaMember *local_1220;
  Fault local_1218;
  Disposer *pDStack_1210;
  undefined8 local_1208;
  EventLoop *local_1200;
  byte local_11f8 [8];
  Disposer *local_11f0;
  PromiseFulfiller<void> *pPStack_11e8;
  FdObserver local_11e0;
  EventLoop local_1188;
  UnixEventPort local_1110;
  SourceLocation local_1018 [170];
  
  captureSignals();
  UnixEventPort::UnixEventPort(&local_1110);
  EventLoop::EventLoop(&local_1188,&local_1110.super_EventPort);
  local_11f8[0] = 0xff;
  local_11f8[1] = 0xff;
  local_11f8[2] = 0xff;
  local_11f8[3] = 0xff;
  local_11f0 = (Disposer *)0x0;
  pPStack_11e8 = (PromiseFulfiller<void> *)0x0;
  local_1200 = &local_1188;
  EventLoop::enterScope(&local_1188);
  local_1208 = (PromiseFulfiller<void> *)0x0;
  do {
    iVar3 = ::pipe((int *)&local_1208);
    if (-1 < iVar3) goto LAB_001e4121;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_11e0.eventPort = (UnixEventPort *)0x0;
    local_1018[0].fileName = (char *)0x0;
    local_1018[0].function = (char *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_11e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_11e0);
  }
LAB_001e4121:
  local_1224 = (uint)local_1208;
  local_1230._8_4_ = local_1208._4_4_;
  setNonblocking(local_1208._4_4_);
  setNonblocking(local_1224);
  UnixEventPort::FdObserver::FdObserver(&local_11e0,&local_1110,local_1230._8_4_,2);
  do {
    do {
      sVar5 = ::write(local_1230._8_4_,"foo",3);
    } while (-1 < sVar5);
    iVar3 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_1218.exception = (Exception *)0x0;
    local_1018[0].fileName = (char *)0x0;
    local_1018[0].function = (char *)0x0;
    kj::_::Debug::Fault::init
              (&local_1218,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_1218);
  }
  local_1231 = '\0';
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_1230);
  uVar2 = local_1230._0_8_;
  SVar1._vptr_SleepHooks = ((SleepHooks *)(local_1230._0_8_ + 8))->_vptr_SleepHooks;
  uVar7 = local_1230._0_8_ - (long)SVar1._vptr_SleepHooks;
  iVar3 = (int)CONCAT71((int7)(uVar7 >> 8),0x27 < uVar7);
  if ((PromiseArena *)SVar1._vptr_SleepHooks != (PromiseArena *)0x0 && 0x27 < uVar7) {
    ((SleepHooks *)(local_1230._0_8_ + 8))->_vptr_SleepHooks = (_func_int **)0x0;
    this_00 = (Exception *)(local_1230._0_8_ + 0xfffffffffffffe70 + 0x168);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_1230,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:577:13)>
               ::anon_class_8_1_79db791e_for_func::operator());
    *(undefined ***)(uVar2 + 0xfffffffffffffe70 + 0x168) = &PTR_destroy_00609d38;
    *(PromiseArena **)(uVar2 + 0xfffffffffffffe70 + 0x188) = (PromiseArena *)&local_1231;
    ((PromiseArenaMember *)(uVar2 + 0xfffffffffffffe70 + 0x170))->_vptr_PromiseArenaMember =
         SVar1._vptr_SleepHooks;
  }
  else {
    pvVar6 = operator_new(0x400);
    this_00 = (Exception *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_1230,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:577:13)>
               ::anon_class_8_1_79db791e_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_00609d38;
    *(undefined1 **)((long)pvVar6 + 0x3f8) = &local_1231;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  local_1018[0].fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  local_1018[0].function = "run";
  local_1018[0].lineNumber = 0x240;
  local_1018[0].columnNumber = 0x12;
  local_1218.exception = this_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_1220,(OwnPromiseNode *)&local_1218,local_1018);
  node_00.exception = local_1218.exception;
  if (local_1218.exception != (Exception *)0x0) {
    local_1218.exception = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.exception);
  }
  uVar2 = local_1230._0_8_;
  if ((Exception *)local_1230._0_8_ != (Exception *)0x0) {
    local_1230._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  ppVar9 = (pollfd *)0xffffffff;
  EventLoop::run(&local_1188,0xffffffff);
  UnixEventPort::poll(&local_1110,ppVar9,__nfds,iVar3);
  EventLoop::run(&local_1188,0xffffffff);
  pcVar8 = (char *)(CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1231) & 0xffffffff ^ 1);
  local_1018[0].fileName = (char *)CONCAT71(local_1018[0].fileName._1_7_,(byte)pcVar8);
  if ((local_1231 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    pcVar8 = "\"failed: expected \" \"!(writable)\", _kjCondition";
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x247,ERROR,"\"failed: expected \" \"!(writable)\", _kjCondition",
               (char (*) [29])"failed: expected !(writable)",(DebugExpression<bool> *)local_1018);
  }
  memset(local_1018,0,0x1000);
  do {
    while( true ) {
      sVar5 = read(local_1224,local_1018,0x1000);
      iVar3 = (int)pcVar8;
      if (sVar5 < 0) break;
      if (sVar5 == 0) {
LAB_001e4379:
        ppVar9 = (pollfd *)0xffffffff;
        EventLoop::run(&local_1188,0xffffffff);
        UnixEventPort::poll(&local_1110,ppVar9,__nfds_00,iVar3);
        EventLoop::run(&local_1188,0xffffffff);
        local_1218.exception = (Exception *)&local_1231;
        if ((local_1231 == '\0') && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::log<char_const(&)[26],kj::_::DebugExpression<bool&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                     ,0x256,ERROR,"\"failed: expected \" \"writable\", _kjCondition",
                     (char (*) [26])"failed: expected writable",
                     (DebugExpression<bool_&> *)&local_1218);
        }
        node = local_1220;
        if (local_1220 != (PromiseArenaMember *)0x0) {
          local_1220 = (PromiseArenaMember *)0x0;
          kj::_::PromiseDisposer::dispose(node);
        }
        UnixEventPort::FdObserver::~FdObserver(&local_11e0);
        OwnFd::~OwnFd((OwnFd *)(local_1230 + 8));
        OwnFd::~OwnFd((OwnFd *)&local_1224);
        EventLoop::leaveScope(&local_1188);
        EventLoop::~EventLoop(&local_1188);
        UnixEventPort::~UnixEventPort(&local_1110);
        return;
      }
    }
    iVar4 = kj::_::Debug::getOsErrorNumber(true);
    iVar3 = (int)pcVar8;
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_1230._0_8_ = (Exception *)0x0;
    local_1218.exception = (Exception *)0x0;
    pDStack_1210 = (Disposer *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)local_1230,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)local_1230);
  }
  goto LAB_001e4379;
}

Assistant:

TEST(AsyncUnixTest, WriteObserver) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2]{};
  KJ_SYSCALL(pipe(pipefds));
  kj::OwnFd infd(pipefds[0]), outfd(pipefds[1]);
  setNonblocking(outfd);
  setNonblocking(infd);

  UnixEventPort::FdObserver observer(port, outfd, UnixEventPort::FdObserver::OBSERVE_WRITE);

  // Fill buffer.
  ssize_t n;
  do {
    KJ_NONBLOCKING_SYSCALL(n = write(outfd, "foo", 3));
  } while (n >= 0);

  bool writable = false;
  auto promise = observer.whenBecomesWritable()
      .then([&]() { writable = true; }).eagerlyEvaluate(nullptr);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_FALSE(writable);

  // Empty the read end so that the write end becomes writable. Note that Linux implements a
  // high watermark / low watermark heuristic which means that only reading one byte is not
  // sufficient. The amount we have to read is in fact architecture-dependent -- it appears to be
  // 1 page. To be safe, we read everything.
  char buffer[4096]{};
  do {
    KJ_NONBLOCKING_SYSCALL(n = read(infd, &buffer, sizeof(buffer)));
  } while (n > 0);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_TRUE(writable);
}